

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaParseWildcardNs
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaWildcardPtr wildc,
              xmlNodePtr node)

{
  int iVar1;
  int iVar2;
  xmlChar *str1;
  xmlNodePtr node_00;
  byte *str1_00;
  xmlHashTablePtr pxVar3;
  xmlAttrPtr attr;
  xmlSchemaTypePtr value;
  int *piVar4;
  undefined8 *puVar5;
  undefined4 uVar6;
  char *in_R8;
  int *piVar7;
  long lVar8;
  int iVar9;
  xmlChar *in_stack_ffffffffffffffa8;
  xmlChar *in_stack_ffffffffffffffb0;
  xmlSchemaParserCtxtPtr pxVar10;
  undefined8 *local_48;
  
  str1 = xmlSchemaGetProp(ctxt,(xmlNodePtr)wildc,"processContents");
  iVar2 = 0;
  uVar6 = 3;
  iVar9 = 0;
  if ((str1 != (xmlChar *)0x0) &&
     (iVar1 = xmlStrEqual(str1,(xmlChar *)"strict"), iVar9 = iVar2, iVar1 == 0)) {
    iVar2 = xmlStrEqual(str1,(xmlChar *)"skip");
    uVar6 = 1;
    if (iVar2 == 0) {
      iVar2 = xmlStrEqual(str1,(xmlChar *)"lax");
      uVar6 = 2;
      if (iVar2 == 0) {
        in_R8 = "(strict | skip | lax)";
        iVar9 = 0xbdd;
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)wildc,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(strict | skip | lax)",(char *)str1,
                   (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
        uVar6 = 3;
      }
    }
  }
  *(undefined4 *)&schema->annot = uVar6;
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)wildc,"namespace");
  str1_00 = xmlSchemaGetNodeContent(ctxt,node_00);
  iVar2 = -1;
  if (str1_00 != (byte *)0x0) {
    if ((node_00 == (xmlNodePtr)0x0) ||
       (iVar1 = xmlStrEqual(str1_00,(xmlChar *)"##any"), iVar1 != 0)) {
      *(undefined4 *)((long)&schema->annot + 4) = 1;
      iVar2 = iVar9;
    }
    else {
      iVar1 = xmlStrEqual(str1_00,(xmlChar *)"##other");
      if (iVar1 == 0) {
        piVar7 = &schema->flags;
        local_48 = (undefined8 *)0x0;
        do {
          while (((ulong)*str1_00 < 0x21 && ((0x100002600U >> ((ulong)*str1_00 & 0x3f) & 1) != 0)))
          {
            str1_00 = str1_00 + 1;
          }
          lVar8 = 0;
          while ((0x20 < (ulong)str1_00[lVar8] ||
                 ((0x100002601U >> ((ulong)str1_00[lVar8] & 0x3f) & 1) == 0))) {
            lVar8 = lVar8 + 1;
          }
          if (lVar8 == 0) {
            return iVar9;
          }
          attr = (xmlAttrPtr)xmlStrndup(str1_00,(int)lVar8);
          iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##other");
          puVar5 = local_48;
          if ((iVar2 == 0) && (iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##any"), iVar2 == 0))
          {
            iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##targetNamespace");
            piVar4 = piVar7;
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##local");
              if (iVar2 == 0) {
                value = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                pxVar10 = ctxt;
                xmlSchemaPValAttrNodeValue
                          (ctxt,(xmlSchemaBasicItemPtr)node_00,attr,(xmlChar *)value,
                           (xmlSchemaTypePtr)in_R8);
                pxVar3 = (xmlHashTablePtr)xmlDictLookup(ctxt->dict,(xmlChar *)attr,-1);
                ctxt = pxVar10;
              }
              else {
                pxVar3 = (xmlHashTablePtr)0x0;
              }
            }
            else {
              pxVar3 = (xmlHashTablePtr)ctxt->targetNamespace;
            }
            do {
              piVar4 = *(int **)piVar4;
              if (piVar4 == (int *)0x0) {
                puVar5 = (undefined8 *)(*xmlMalloc)(0x10);
                if (puVar5 == (undefined8 *)0x0) {
                  xmlSchemaPErrMemory(ctxt);
                  puVar5 = (undefined8 *)0x0;
                }
                else {
                  *puVar5 = 0;
                  puVar5[1] = 0;
                }
                if (puVar5 == (undefined8 *)0x0) {
                  (*xmlFree)(attr);
                  return -1;
                }
                puVar5[1] = pxVar3;
                *puVar5 = 0;
                if (*(long *)piVar7 == 0) {
                  *(undefined8 **)piVar7 = puVar5;
                }
                else if (local_48 != (undefined8 *)0x0) {
                  *local_48 = puVar5;
                }
                break;
              }
            } while (pxVar3 != *(xmlHashTablePtr *)(piVar4 + 2));
          }
          else {
            iVar9 = 0x700;
            in_R8 = "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))";
            xmlSchemaPSimpleTypeErr
                      (ctxt,XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,(xmlSchemaBasicItemPtr)node_00,
                       (xmlNodePtr)0x0,
                       (xmlSchemaTypePtr)
                       "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))",
                       (char *)attr,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,
                       (xmlChar *)ctxt);
          }
          local_48 = puVar5;
          str1_00 = str1_00 + lVar8;
          (*xmlFree)(attr);
          iVar2 = iVar9;
        } while (*str1_00 != 0);
      }
      else {
        pxVar3 = (xmlHashTablePtr)(*xmlMalloc)(0x10);
        if (pxVar3 == (xmlHashTablePtr)0x0) {
          xmlSchemaPErrMemory(ctxt);
          pxVar3 = (xmlHashTablePtr)0x0;
        }
        else {
          pxVar3->table = (xmlHashEntry *)0x0;
          pxVar3->size = 0;
          pxVar3->nbElems = 0;
        }
        schema->typeDecl = pxVar3;
        if (pxVar3 != (xmlHashTablePtr)0x0) {
          *(xmlChar **)&pxVar3->size = ctxt->targetNamespace;
          iVar2 = iVar9;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaParseWildcardNs(xmlSchemaParserCtxtPtr ctxt,
			 xmlSchemaPtr schema ATTRIBUTE_UNUSED,
			 xmlSchemaWildcardPtr wildc,
			 xmlNodePtr node)
{
    const xmlChar *pc, *ns, *dictnsItem;
    int ret = 0;
    xmlChar *nsItem;
    xmlSchemaWildcardNsPtr tmp, lastNs = NULL;
    xmlAttrPtr attr;

    pc = xmlSchemaGetProp(ctxt, node, "processContents");
    if ((pc == NULL)
        || (xmlStrEqual(pc, (const xmlChar *) "strict"))) {
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
    } else if (xmlStrEqual(pc, (const xmlChar *) "skip")) {
        wildc->processContents = XML_SCHEMAS_ANY_SKIP;
    } else if (xmlStrEqual(pc, (const xmlChar *) "lax")) {
        wildc->processContents = XML_SCHEMAS_ANY_LAX;
    } else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, node,
	    NULL, "(strict | skip | lax)", pc,
	    NULL, NULL, NULL);
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
    }
    /*
     * Build the namespace constraints.
     */
    attr = xmlSchemaGetPropNode(node, "namespace");
    ns = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (ns == NULL)
        return (-1);
    if ((attr == NULL) || (xmlStrEqual(ns, BAD_CAST "##any")))
	wildc->any = 1;
    else if (xmlStrEqual(ns, BAD_CAST "##other")) {
	wildc->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (wildc->negNsSet == NULL) {
	    return (-1);
	}
	wildc->negNsSet->value = ctxt->targetNamespace;
    } else {
	const xmlChar *end, *cur;

	cur = ns;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    nsItem = xmlStrndup(cur, end - cur);
	    if ((xmlStrEqual(nsItem, BAD_CAST "##other")) ||
		    (xmlStrEqual(nsItem, BAD_CAST "##any"))) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,
		    NULL, (xmlNodePtr) attr,
		    NULL,
		    "((##any | ##other) | List of (xs:anyURI | "
		    "(##targetNamespace | ##local)))",
		    nsItem, NULL, NULL, NULL);
		ret = XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER;
	    } else {
		if (xmlStrEqual(nsItem, BAD_CAST "##targetNamespace")) {
		    dictnsItem = ctxt->targetNamespace;
		} else if (xmlStrEqual(nsItem, BAD_CAST "##local")) {
		    dictnsItem = NULL;
		} else {
		    /*
		    * Validate the item (anyURI).
		    */
		    xmlSchemaPValAttrNodeValue(ctxt, NULL, attr,
			nsItem, xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI));
		    dictnsItem = xmlDictLookup(ctxt->dict, nsItem, -1);
		}
		/*
		* Avoid duplicate namespaces.
		*/
		tmp = wildc->nsSet;
		while (tmp != NULL) {
		    if (dictnsItem == tmp->value)
			break;
		    tmp = tmp->next;
		}
		if (tmp == NULL) {
		    tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
		    if (tmp == NULL) {
			xmlFree(nsItem);
			return (-1);
		    }
		    tmp->value = dictnsItem;
		    tmp->next = NULL;
		    if (wildc->nsSet == NULL)
			wildc->nsSet = tmp;
		    else if (lastNs != NULL)
			lastNs->next = tmp;
		    lastNs = tmp;
		}

	    }
	    xmlFree(nsItem);
	    cur = end;
	} while (*cur != 0);
    }
    return (ret);
}